

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O2

BlockDivisionInfo *
adios2::helper::DivideBlock
          (BlockDivisionInfo *__return_storage_ptr__,Dims *count,size_t subblockSize,
          BlockDivisionMethod divisionMethod)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  ostream *poVar6;
  ulong uVar7;
  ushort uVar8;
  ushort uVar9;
  ulong uVar10;
  ulong __new_size;
  allocator local_b4;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (divisionMethod != Contiguous) {
    std::__cxx11::string::string((string *)&local_b0,"Helper",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"adiosMath",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"DivideBlock",&local_b3);
    std::__cxx11::string::string
              ((string *)&local_90,
               "adios2::helper::DivideBlock() only works with Contiguous division method",&local_b4)
    ;
    Throw<std::invalid_argument>(&local_b0,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  __new_size = (long)(count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3;
  sVar5 = GetTotalSize(count,1);
  uVar10 = sVar5 / subblockSize + (ulong)((sVar5 / subblockSize) * subblockSize < sVar5);
  if (0x1000 < uVar10) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "ADIOS WARNING: The StatsBlockSize parameter is causing a data block to be divided up to more than 4096 sub-blocks.  This is an artificial limit to avoid metadata explosion."
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar10 = 0x1000;
  }
  (__return_storage_ptr__->ReverseDivProduct).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->ReverseDivProduct).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->ReverseDivProduct).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->SubBlockSize = subblockSize;
  __return_storage_ptr__->DivisionMethod = divisionMethod;
  local_b0._M_dataplus._M_p._0_2_ = 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&__return_storage_ptr__->Div,__new_size,(value_type_conflict7 *)&local_b0);
  local_b0._M_dataplus._M_p._0_2_ = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&__return_storage_ptr__->Rem,__new_size,(value_type_conflict7 *)&local_b0);
  local_b0._M_dataplus._M_p._0_2_ = 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&__return_storage_ptr__->ReverseDivProduct,__new_size,(value_type_conflict7 *)&local_b0
            );
  uVar9 = 1;
  if (uVar10 != 0) {
    uVar9 = (ushort)uVar10;
  }
  __return_storage_ptr__->NBlocks = uVar9;
  if (1 < uVar9) {
    puVar1 = (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->Div).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; (uVar9 = (ushort)uVar10, 1 < uVar9 && (uVar7 < __new_size)); uVar7 = uVar7 + 1)
    {
      uVar3 = puVar1[uVar7];
      uVar4 = 1;
      uVar8 = uVar9;
      if (uVar3 <= (uVar10 & 0xffff)) {
        uVar8 = (ushort)uVar3;
        uVar4 = (uint)(uVar9 / uVar8);
      }
      puVar2[uVar7] = uVar8;
      uVar10 = (ulong)uVar4;
    }
    CalculateSubblockInfo(count,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BlockDivisionInfo DivideBlock(const Dims &count, const size_t subblockSize,
                              const BlockDivisionMethod divisionMethod)
{
    if (divisionMethod != BlockDivisionMethod::Contiguous)
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosMath", "DivideBlock",
                                             "adios2::helper::DivideBlock() only "
                                             "works with Contiguous division method");
    }
    const size_t ndim = count.size();
    const size_t nElems = helper::GetTotalSize(count);
    size_t nBlocks64 = nElems / subblockSize;
    if (nElems > nBlocks64 * subblockSize)
    {
        ++nBlocks64;
    }
    if (nBlocks64 > 4096)
    {
        std::cerr << "ADIOS WARNING: The StatsBlockSize parameter is causing a "
                     "data block to be divided up to more than 4096 sub-blocks. "
                     " This is an artificial limit to avoid metadata explosion."
                  << std::endl;
        nBlocks64 = 4096;
    }

    BlockDivisionInfo info;
    info.SubBlockSize = subblockSize;
    info.DivisionMethod = divisionMethod;
    info.Div.resize(ndim, 1);
    info.Rem.resize(ndim, 0);
    info.ReverseDivProduct.resize(ndim, 1);
    info.NBlocks = static_cast<uint16_t>(nBlocks64);
    if (info.NBlocks == 0)
    {
        info.NBlocks = 1;
    }

    if (info.NBlocks > 1)
    {
        /* Split the block into 'nBlocks' subblocks */
        /* FIXME: What about column-major dimension order here? */
        size_t i = 0;
        uint16_t n = info.NBlocks;
        size_t dim;
        uint16_t div = 1;
        while (n > 1 && i < ndim)
        {
            dim = count[i];
            if (n < dim)
            {
                div = n;
                n = 1;
            }
            else
            {
                div = static_cast<uint16_t>(dim);
                n = static_cast<uint16_t>(n / dim); // calming VS++
            }
            info.Div[i] = div;
            ++i;
        }
        CalculateSubblockInfo(count, info);
    }
    return info;
}